

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar38;
  byte bVar39;
  uchar uVar40;
  int iVar41;
  stbi__uint32 sVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  stbi__jpeg *psVar47;
  char *pcVar48;
  long lVar49;
  ulong uVar50;
  stbi__uint16 *data_00;
  uchar *data_01;
  void *pvVar51;
  code *pcVar52;
  stbi__context *psVar53;
  float *data_02;
  uchar *puVar54;
  byte *pbVar55;
  bool bVar56;
  long lVar57;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar58;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar59;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  stbi_uc *extraout_RDX_11;
  stbi_uc *extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  stbi_uc *psVar60;
  short sVar61;
  uint uVar62;
  ulong uVar63;
  uint uVar64;
  stbi_uc *psVar65;
  stbi_uc *psVar66;
  short *psVar67;
  undefined7 uVar68;
  undefined4 in_register_00000084;
  long lVar69;
  stbi__result_info *ri_00;
  ulong uVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  stbi_uc (*pasVar75) [4];
  stbi__context *psVar76;
  int *piVar77;
  uint uVar78;
  uint uVar79;
  stbi__uint16 *psVar80;
  long in_FS_OFFSET;
  bool bVar81;
  undefined1 auVar82 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int iVar120;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_89c8;
  uint local_8990;
  int local_8974;
  ulong local_8960;
  undefined1 local_8948 [12];
  uint uStack_893c;
  undefined1 local_8938 [12];
  uint uStack_892c;
  int local_8928;
  int *local_8918;
  anon_struct_96_18_0d0905d3 *local_8910;
  uint local_8908;
  int local_8904;
  int local_8900;
  uint local_88fc;
  stbi_uc *local_88f8;
  int *local_88f0;
  ulong local_88e8;
  stbi__uint32 local_88dc;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar60 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8918 = comp;
  psVar47 = (stbi__jpeg *)malloc(0x4888);
  psVar47->s = s;
  psVar47->idct_block_kernel = stbi__idct_simd;
  psVar47->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar47->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar47->jfif = 0;
  psVar47->app14_color_transform = -1;
  psVar47->marker = 0xff;
  sVar38 = stbi__get_marker(psVar47);
  if (sVar38 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar47);
  if (sVar38 == 0xd8) {
    psVar47 = (stbi__jpeg *)malloc(0x4888);
    psVar47->s = s;
    psVar47->idct_block_kernel = stbi__idct_simd;
    psVar47->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar47->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar47->img_comp;
      lVar49 = 0x46d8;
      do {
        psVar60 = psVar47->huff_dc[0].fast + lVar49 + -8;
        psVar60[0] = '\0';
        psVar60[1] = '\0';
        psVar60[2] = '\0';
        psVar60[3] = '\0';
        psVar60[4] = '\0';
        psVar60[5] = '\0';
        psVar60[6] = '\0';
        psVar60[7] = '\0';
        psVar60[8] = '\0';
        psVar60[9] = '\0';
        psVar60[10] = '\0';
        psVar60[0xb] = '\0';
        psVar60[0xc] = '\0';
        psVar60[0xd] = '\0';
        psVar60[0xe] = '\0';
        psVar60[0xf] = '\0';
        lVar49 = lVar49 + 0x60;
      } while (lVar49 != 0x4858);
      psVar47->restart_interval = 0;
      iVar41 = stbi__decode_jpeg_header(psVar47,0);
      uVar79 = extraout_EDX;
      if (iVar41 != 0) {
        bVar39 = stbi__get_marker(psVar47);
        local_88f0 = psVar47->huff_ac[0].delta + 9;
LAB_00153976:
        if (bVar39 == 0xda) {
          iVar41 = stbi__get16be(psVar47->s);
          psVar53 = psVar47->s;
          pbVar55 = psVar53->img_buffer;
          paVar59 = extraout_RDX_00;
          if (pbVar55 < psVar53->img_buffer_end) {
LAB_00153a6d:
            psVar53->img_buffer = pbVar55 + 1;
            bVar39 = *pbVar55;
          }
          else {
            if (psVar53->read_from_callbacks != 0) {
              psVar60 = psVar53->buffer_start;
              iVar73 = (*(psVar53->io).read)(psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
              if (iVar73 == 0) {
                psVar53->read_from_callbacks = 0;
                psVar53->img_buffer = psVar60;
                psVar53->img_buffer_end = psVar53->buffer_start + 1;
                psVar53->buffer_start[0] = '\0';
              }
              else {
                psVar53->img_buffer = psVar60;
                psVar53->img_buffer_end = psVar60 + iVar73;
              }
              pbVar55 = psVar53->img_buffer;
              paVar59 = extraout_RDX_01;
              goto LAB_00153a6d;
            }
            bVar39 = 0;
          }
          psVar47->scan_n = (uint)bVar39;
          if (((0xfb < (byte)(bVar39 - 5)) && ((int)(uint)bVar39 <= psVar47->s->img_n)) &&
             (iVar41 == (uint)bVar39 * 2 + 6)) {
            if (bVar39 != 0) {
              lVar49 = 0;
              do {
                psVar53 = psVar47->s;
                pbVar55 = psVar53->img_buffer;
                if (pbVar55 < psVar53->img_buffer_end) {
LAB_00153b2a:
                  psVar53->img_buffer = pbVar55 + 1;
                  uVar43 = (uint)*pbVar55;
                }
                else {
                  if (psVar53->read_from_callbacks != 0) {
                    psVar60 = psVar53->buffer_start;
                    iVar41 = (*(psVar53->io).read)
                                       (psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
                    if (iVar41 == 0) {
                      psVar53->read_from_callbacks = 0;
                      psVar53->img_buffer = psVar60;
                      psVar53->img_buffer_end = psVar53->buffer_start + 1;
                      psVar53->buffer_start[0] = '\0';
                    }
                    else {
                      psVar53->img_buffer = psVar60;
                      psVar53->img_buffer_end = psVar60 + iVar41;
                    }
                    pbVar55 = psVar53->img_buffer;
                    goto LAB_00153b2a;
                  }
                  uVar43 = 0;
                }
                psVar53 = psVar47->s;
                pbVar55 = psVar53->img_buffer;
                if (pbVar55 < psVar53->img_buffer_end) {
LAB_00153bad:
                  psVar53->img_buffer = pbVar55 + 1;
                  bVar39 = *pbVar55;
                }
                else {
                  if (psVar53->read_from_callbacks != 0) {
                    psVar60 = psVar53->buffer_start;
                    iVar41 = (*(psVar53->io).read)
                                       (psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
                    if (iVar41 == 0) {
                      psVar53->read_from_callbacks = 0;
                      psVar53->img_buffer = psVar60;
                      psVar53->img_buffer_end = psVar53->buffer_start + 1;
                      psVar53->buffer_start[0] = '\0';
                    }
                    else {
                      psVar53->img_buffer = psVar60;
                      psVar53->img_buffer_end = psVar60 + iVar41;
                    }
                    pbVar55 = psVar53->img_buffer;
                    goto LAB_00153bad;
                  }
                  bVar39 = 0;
                }
                uVar79 = psVar47->s->img_n;
                if ((int)uVar79 < 1) {
                  uVar63 = 0;
                }
                else {
                  uVar63 = 0;
                  paVar59 = paVar1;
                  do {
                    if (paVar59->id == uVar43) goto LAB_00153bdf;
                    uVar63 = uVar63 + 1;
                    paVar59 = paVar59 + 1;
                  } while (uVar79 != uVar63);
                  uVar63 = (ulong)uVar79;
                }
LAB_00153bdf:
                if ((uint)uVar63 == uVar79) goto LAB_00154f1d;
                uVar50 = uVar63 & 0xffffffff;
                paVar59 = (anon_struct_96_18_0d0905d3 *)(uVar50 * 0x60);
                psVar47->img_comp[uVar50].hd = (uint)(bVar39 >> 4);
                if (0x3f < bVar39) goto LAB_00154f0d;
                paVar59 = paVar1 + uVar50;
                paVar59->ha = bVar39 & 0xf;
                if (3 < (bVar39 & 0xf)) goto LAB_00154f0d;
                psVar47->order[lVar49] = (uint)uVar63;
                lVar49 = lVar49 + 1;
              } while (lVar49 < psVar47->scan_n);
            }
            psVar53 = psVar47->s;
            pbVar55 = psVar53->img_buffer;
            if (pbVar55 < psVar53->img_buffer_end) {
LAB_00153cb0:
              psVar53->img_buffer = pbVar55 + 1;
              uVar79 = (uint)*pbVar55;
            }
            else {
              if (psVar53->read_from_callbacks != 0) {
                psVar60 = psVar53->buffer_start;
                iVar41 = (*(psVar53->io).read)
                                   (psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
                if (iVar41 == 0) {
                  psVar53->read_from_callbacks = 0;
                  psVar53->img_buffer = psVar60;
                  psVar53->img_buffer_end = psVar53->buffer_start + 1;
                  psVar53->buffer_start[0] = '\0';
                }
                else {
                  psVar53->img_buffer = psVar60;
                  psVar53->img_buffer_end = psVar60 + iVar41;
                }
                pbVar55 = psVar53->img_buffer;
                paVar59 = extraout_RDX_02;
                goto LAB_00153cb0;
              }
              uVar79 = 0;
            }
            psVar47->spec_start = uVar79;
            psVar53 = psVar47->s;
            pbVar55 = psVar53->img_buffer;
            if (pbVar55 < psVar53->img_buffer_end) {
LAB_00153d39:
              psVar53->img_buffer = pbVar55 + 1;
              uVar79 = (uint)*pbVar55;
            }
            else {
              if (psVar53->read_from_callbacks != 0) {
                psVar60 = psVar53->buffer_start;
                iVar41 = (*(psVar53->io).read)
                                   (psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
                if (iVar41 == 0) {
                  psVar53->read_from_callbacks = 0;
                  psVar53->img_buffer = psVar60;
                  psVar53->img_buffer_end = psVar53->buffer_start + 1;
                  psVar53->buffer_start[0] = '\0';
                }
                else {
                  psVar53->img_buffer = psVar60;
                  psVar53->img_buffer_end = psVar60 + iVar41;
                }
                pbVar55 = psVar53->img_buffer;
                paVar59 = extraout_RDX_03;
                goto LAB_00153d39;
              }
              uVar79 = 0;
            }
            psVar47->spec_end = uVar79;
            psVar53 = psVar47->s;
            psVar60 = psVar53->img_buffer;
            if (psVar60 < psVar53->img_buffer_end) {
LAB_00153dc2:
              psVar53->img_buffer = psVar60 + 1;
              paVar59 = (anon_struct_96_18_0d0905d3 *)CONCAT71((int7)((ulong)paVar59 >> 8),*psVar60)
              ;
            }
            else {
              if (psVar53->read_from_callbacks != 0) {
                psVar60 = psVar53->buffer_start;
                iVar41 = (*(psVar53->io).read)
                                   (psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
                if (iVar41 == 0) {
                  psVar53->read_from_callbacks = 0;
                  psVar53->img_buffer = psVar60;
                  psVar53->img_buffer_end = psVar53->buffer_start + 1;
                  psVar53->buffer_start[0] = '\0';
                }
                else {
                  psVar53->img_buffer = psVar60;
                  psVar53->img_buffer_end = psVar60 + iVar41;
                }
                psVar60 = psVar53->img_buffer;
                paVar59 = extraout_RDX_04;
                goto LAB_00153dc2;
              }
              paVar59 = (anon_struct_96_18_0d0905d3 *)0x0;
            }
            psVar47->succ_high = (int)(((ulong)paVar59 & 0xff) >> 4);
            uVar79 = (uint)((ulong)paVar59 & 0xff) & 0xf;
            psVar47->succ_low = uVar79;
            iVar41 = psVar47->progressive;
            iVar73 = psVar47->spec_start;
            if (iVar41 != 0) {
              if (((iVar73 < 0x40) && (psVar47->spec_end < 0x40)) &&
                 ((iVar73 <= psVar47->spec_end && (((byte)paVar59 < 0xe0 && (uVar79 < 0xe))))))
              goto LAB_00153e4f;
              goto LAB_00154f0d;
            }
            if ((iVar73 != 0) || ((0xf < (byte)paVar59 || (((ulong)paVar59 & 0xf) != 0))))
            goto LAB_00154f0d;
            psVar47->spec_end = 0x3f;
LAB_00153e4f:
            iVar73 = psVar47->scan_n;
            uVar63 = (ulong)(uint)psVar47->restart_interval;
            if (psVar47->restart_interval == 0) {
              uVar63 = 0x7fffffff;
            }
            psVar47->code_buffer = 0;
            psVar47->code_bits = 0;
            psVar47->nomore = 0;
            psVar47->img_comp[3].dc_pred = 0;
            psVar47->img_comp[2].dc_pred = 0;
            psVar47->img_comp[1].dc_pred = 0;
            psVar47->img_comp[0].dc_pred = 0;
            psVar47->marker = 0xff;
            uVar79 = (uint)uVar63;
            psVar47->todo = uVar79;
            psVar47->eob_run = 0;
            if (iVar41 == 0) {
              if (iVar73 == 1) {
                iVar41 = psVar47->order[0];
                iVar73 = psVar47->img_comp[iVar41].y + 7 >> 3;
                if (0 < iVar73) {
                  uVar43 = paVar1[iVar41].x + 7 >> 3;
                  iVar72 = 0;
                  iVar71 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      lVar49 = 0;
                      do {
                        iVar45 = stbi__jpeg_decode_block
                                           (psVar47,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar47->huff_dc[paVar1[iVar41].hd].fast,
                                            (stbi__huffman *)
                                            psVar47->huff_ac[paVar1[iVar41].ha].fast,
                                            psVar47->fast_ac[paVar1[iVar41].ha],iVar41,
                                            psVar47->dequant[paVar1[iVar41].tq]);
                        if (iVar45 == 0) {
                          bVar81 = false;
                          local_89c8 = 0;
                          uVar63 = extraout_RDX_05;
                        }
                        else {
                          (*psVar47->idct_block_kernel)
                                    (paVar1[iVar41].data + lVar49 + iVar72 * paVar1[iVar41].w2,
                                     paVar1[iVar41].w2,(short *)&local_88a8);
                          iVar45 = psVar47->todo;
                          psVar47->todo = iVar45 + -1;
                          bVar81 = true;
                          uVar63 = extraout_RDX_06;
                          if (iVar45 < 2) {
                            if (psVar47->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar47);
                              uVar63 = extraout_RDX_07;
                            }
                            if ((psVar47->marker & 0xf8) == 0xd0) {
                              psVar47->code_buffer = 0;
                              psVar47->code_bits = 0;
                              psVar47->nomore = 0;
                              psVar47->img_comp[3].dc_pred = 0;
                              psVar47->img_comp[2].dc_pred = 0;
                              psVar47->img_comp[1].dc_pred = 0;
                              psVar47->img_comp[0].dc_pred = 0;
                              psVar47->marker = 0xff;
                              iVar45 = psVar47->restart_interval;
                              uVar63 = 0x7fffffff;
                              if (iVar45 == 0) {
                                iVar45 = 0x7fffffff;
                              }
                              psVar47->todo = iVar45;
                              psVar47->eob_run = 0;
                            }
                            else {
                              local_89c8 = 1;
                              bVar81 = false;
                            }
                          }
                        }
                        uVar79 = (uint)uVar63;
                        if (!bVar81) {
                          iVar41 = (int)local_89c8;
                          goto LAB_00154ce4;
                        }
                        lVar49 = lVar49 + 8;
                      } while ((ulong)uVar43 * 8 - lVar49 != 0);
                    }
                    uVar79 = (uint)uVar63;
                    iVar71 = iVar71 + 1;
                    iVar72 = iVar72 + 8;
                  } while (iVar71 != iVar73);
                }
LAB_00154a8b:
                iVar41 = 1;
              }
              else {
                iVar41 = 1;
                if (0 < psVar47->img_mcu_y) {
                  iVar73 = 0;
                  do {
                    if (0 < psVar47->img_mcu_x) {
                      iVar71 = 0;
                      do {
                        if (0 < psVar47->scan_n) {
                          uVar50 = 0;
                          do {
                            local_8960 = uVar50;
                            iVar41 = psVar47->order[local_8960];
                            local_89c8 = (ulong)iVar41;
                            if (0 < psVar47->img_comp[local_89c8].v) {
                              iVar72 = 0;
                              bVar81 = true;
                              do {
                                iVar45 = paVar1[local_89c8].h;
                                if (0 < iVar45) {
                                  iVar74 = 0;
                                  do {
                                    iVar120 = paVar1[local_89c8].v;
                                    iVar46 = stbi__jpeg_decode_block
                                                       (psVar47,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar47->huff_dc[paVar1[local_89c8].hd].fast
                                                        ,(stbi__huffman *)
                                                         psVar47->huff_ac[paVar1[local_89c8].ha].
                                                         fast,psVar47->fast_ac
                                                              [paVar1[local_89c8].ha],iVar41,
                                                        psVar47->dequant[paVar1[local_89c8].tq]);
                                    uVar79 = (uint)extraout_RDX_09;
                                    if (iVar46 == 0) {
                                      uVar63 = extraout_RDX_09;
                                      if (bVar81) goto LAB_00154cc7;
                                      goto LAB_00154bea;
                                    }
                                    (*psVar47->idct_block_kernel)
                                              (paVar1[local_89c8].data +
                                               (long)((iVar45 * iVar71 + iVar74) * 8) +
                                               (long)((iVar120 * iVar73 + iVar72) *
                                                      paVar1[local_89c8].w2 * 8),
                                               paVar1[local_89c8].w2,(short *)&local_88a8);
                                    iVar74 = iVar74 + 1;
                                    iVar45 = paVar1[local_89c8].h;
                                    uVar63 = extraout_RDX_10;
                                  } while (iVar74 < iVar45);
                                }
                                iVar72 = iVar72 + 1;
                                bVar81 = iVar72 < paVar1[local_89c8].v;
                              } while (iVar72 < paVar1[local_89c8].v);
                            }
LAB_00154bea:
                            uVar50 = local_8960 + 1;
                          } while ((long)(local_8960 + 1) < (long)psVar47->scan_n);
                        }
                        uVar79 = (uint)uVar63;
                        iVar72 = psVar47->todo;
                        psVar47->todo = iVar72 + -1;
                        iVar41 = 1;
                        if (iVar72 < 2) {
                          if (psVar47->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar47);
                            uVar79 = extraout_EDX_02;
                          }
                          if ((psVar47->marker & 0xf8) != 0xd0) goto LAB_00154ce4;
                          psVar47->code_buffer = 0;
                          psVar47->code_bits = 0;
                          psVar47->nomore = 0;
                          psVar47->img_comp[3].dc_pred = 0;
                          psVar47->img_comp[2].dc_pred = 0;
                          psVar47->img_comp[1].dc_pred = 0;
                          psVar47->img_comp[0].dc_pred = 0;
                          psVar47->marker = 0xff;
                          iVar41 = psVar47->restart_interval;
                          uVar63 = 0x7fffffff;
                          if (iVar41 == 0) {
                            iVar41 = 0x7fffffff;
                          }
                          psVar47->todo = iVar41;
                          psVar47->eob_run = 0;
                        }
                        iVar71 = iVar71 + 1;
                      } while (iVar71 < psVar47->img_mcu_x);
                    }
                    uVar79 = (uint)uVar63;
                    iVar41 = 1;
                    iVar73 = iVar73 + 1;
                  } while (iVar73 < psVar47->img_mcu_y);
                }
              }
            }
            else if (iVar73 == 1) {
              local_88e8 = (ulong)psVar47->order[0];
              local_8900 = psVar47->img_comp[local_88e8].y + 7 >> 3;
              iVar41 = 1;
              if (0 < local_8900) {
                paVar59 = paVar1 + local_88e8;
                uVar43 = psVar47->img_comp[local_88e8].x + 7 >> 3;
                local_8974 = 0;
                local_8910 = paVar59;
                do {
                  if (0 < (int)uVar43) {
                    uVar63 = 0;
                    do {
                      piVar77 = local_88f0;
                      uVar79 = (uint)uVar63;
                      psVar67 = paVar59->coeff +
                                (int)((paVar59->coeff_w * local_8974 + uVar79) * 0x40);
                      uVar63 = (ulong)psVar47->spec_start;
                      if (uVar63 == 0) {
                        iVar41 = stbi__jpeg_decode_block_prog_dc
                                           (psVar47,psVar67,
                                            (stbi__huffman *)psVar47->huff_dc[paVar59->hd].fast,
                                            (int)local_88e8);
                        if (iVar41 != 0) goto LAB_00154360;
                        bVar81 = false;
                        local_8960 = 0;
                      }
                      else {
                        lVar49 = (long)paVar59->ha;
                        iVar41 = psVar47->eob_run;
                        bVar39 = (byte)psVar47->succ_low;
                        if (psVar47->succ_high == 0) {
                          if (iVar41 == 0) {
                            do {
                              if (psVar47->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar47);
                              }
                              sVar61 = psVar47->fast_ac[lVar49][psVar47->code_buffer >> 0x17];
                              uVar62 = (uint)sVar61;
                              iVar41 = (int)uVar63;
                              if (sVar61 == 0) {
                                if (psVar47->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar47);
                                }
                                uVar62 = psVar47->code_buffer;
                                uVar50 = (ulong)psVar47->huff_ac[lVar49].fast[uVar62 >> 0x17];
                                if (uVar50 == 0xff) {
                                  lVar57 = 0;
                                  do {
                                    lVar69 = lVar57;
                                    lVar57 = lVar69 + 1;
                                  } while ((uint)piVar77[lVar49 * 0x1a4 + lVar69 + -0x11] <=
                                           uVar62 >> 0x10);
                                  iVar73 = psVar47->code_bits;
                                  if (lVar57 == 8) {
                                    psVar47->code_bits = iVar73 + -0x10;
                                    uVar64 = 0xffffffff;
                                  }
                                  else {
                                    uVar64 = 0xffffffff;
                                    if ((int)(lVar69 + 10) <= iVar73) {
                                      uVar64 = stbi__bmask[lVar69 + 10];
                                      iVar71 = piVar77[lVar49 * 0x1a4 + lVar57];
                                      psVar47->code_bits = (iVar73 - (int)lVar57) + -9;
                                      psVar47->code_buffer = uVar62 << ((byte)(lVar69 + 10) & 0x1f);
                                      uVar50 = (ulong)(int)((uVar62 >> (0x17U - (char)lVar57 & 0x1f)
                                                            & uVar64) + iVar71);
                                      goto LAB_00154584;
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar47->huff_ac[lVar49].size[uVar50];
                                  uVar64 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar47->code_bits) {
                                    psVar47->code_buffer = uVar62 << (bVar2 & 0x1f);
                                    psVar47->code_bits = psVar47->code_bits - (uint)bVar2;
LAB_00154584:
                                    uVar64 = (uint)psVar47->huff_ac[lVar49].values[uVar50];
                                  }
                                }
                                if ((int)uVar64 < 0) {
                                  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
                                  iVar41 = 1;
                                }
                                else {
                                  uVar62 = uVar64 >> 4;
                                  uVar78 = uVar64 & 0xf;
                                  if (uVar78 != 0) {
                                    lVar57 = (long)iVar41 + (ulong)uVar62;
                                    bVar2 = ""[lVar57];
                                    if (psVar47->code_bits < (int)uVar78) {
                                      stbi__grow_buffer_unsafe(psVar47);
                                    }
                                    uVar62 = psVar47->code_buffer;
                                    uVar58 = uVar62 << (sbyte)uVar78 |
                                             uVar62 >> 0x20 - (sbyte)uVar78;
                                    uVar64 = *(uint *)((long)stbi__bmask + (ulong)(uVar78 * 4));
                                    psVar47->code_buffer = ~uVar64 & uVar58;
                                    psVar47->code_bits = psVar47->code_bits - uVar78;
                                    iVar41 = 0;
                                    iVar73 = 0;
                                    if (-1 < (int)uVar62) {
                                      iVar73 = *(int *)((long)stbi__jbias + (ulong)(uVar78 * 4));
                                    }
                                    uVar63 = (ulong)((int)lVar57 + 1);
                                    psVar67[bVar2] =
                                         (short)((uVar58 & uVar64) + iVar73 << (bVar39 & 0x1f));
                                    bVar81 = true;
                                    goto LAB_001546cd;
                                  }
                                  if (0xef < uVar64) {
                                    uVar64 = iVar41 + 0x10;
                                    goto LAB_001544a3;
                                  }
                                  psVar47->eob_run = 1 << ((byte)uVar62 & 0x1f);
                                  if (0xf < uVar64) {
                                    if (psVar47->code_bits < (int)uVar62) {
                                      stbi__grow_buffer_unsafe(psVar47);
                                    }
                                    bVar2 = (byte)uVar62 & 0x1f;
                                    uVar78 = psVar47->code_buffer << bVar2 |
                                             psVar47->code_buffer >> 0x20 - bVar2;
                                    uVar64 = stbi__bmask[uVar62];
                                    psVar47->code_buffer = ~uVar64 & uVar78;
                                    psVar47->code_bits = psVar47->code_bits - uVar62;
                                    psVar47->eob_run = psVar47->eob_run + (uVar78 & uVar64);
                                  }
                                  psVar47->eob_run = psVar47->eob_run + -1;
                                  iVar41 = 2;
                                }
                                bVar81 = false;
                              }
                              else {
                                psVar47->code_buffer = psVar47->code_buffer << (sbyte)(uVar62 & 0xf)
                                ;
                                psVar47->code_bits = psVar47->code_bits - (uVar62 & 0xf);
                                lVar57 = (long)iVar41 + (ulong)(uVar62 >> 4 & 0xf);
                                uVar64 = (int)lVar57 + 1;
                                psVar67[""[lVar57]] = (short)((uVar62 >> 8) << (bVar39 & 0x1f));
LAB_001544a3:
                                uVar63 = (ulong)uVar64;
                                iVar41 = 0;
                                bVar81 = true;
                              }
LAB_001546cd:
                              bVar56 = false;
                              bVar29 = true;
                              if (iVar41 != 0) {
                                bVar56 = false;
                                if (iVar41 != 2) {
                                  bVar29 = bVar81;
                                  bVar56 = false;
                                }
                                break;
                              }
                            } while ((int)uVar63 <= psVar47->spec_end);
                          }
                          else {
                            psVar47->eob_run = iVar41 + -1;
                            bVar29 = false;
                            bVar56 = true;
                          }
                          if (bVar29) goto LAB_00154336;
                        }
                        else {
                          if (iVar41 == 0) {
                            uVar62 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                            local_89c8 = (ulong)uVar62;
                            do {
                              if (psVar47->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar47);
                              }
                              uVar64 = psVar47->code_buffer;
                              uVar50 = (ulong)psVar47->huff_ac[lVar49].fast[uVar64 >> 0x17];
                              if (uVar50 == 0xff) {
                                lVar57 = 0;
                                do {
                                  lVar69 = lVar57;
                                  lVar57 = lVar69 + 1;
                                } while ((uint)piVar77[lVar49 * 0x1a4 + lVar69 + -0x11] <=
                                         uVar64 >> 0x10);
                                iVar41 = psVar47->code_bits;
                                if (lVar57 == 8) {
                                  psVar47->code_bits = iVar41 + -0x10;
                                  uVar78 = 0xffffffff;
                                }
                                else {
                                  uVar78 = 0xffffffff;
                                  if ((int)(lVar69 + 10) <= iVar41) {
                                    uVar78 = stbi__bmask[lVar69 + 10];
                                    iVar73 = piVar77[lVar49 * 0x1a4 + lVar57];
                                    psVar47->code_bits = (iVar41 - (int)lVar57) + -9;
                                    psVar47->code_buffer = uVar64 << ((byte)(lVar69 + 10) & 0x1f);
                                    uVar50 = (ulong)(int)((uVar64 >> (0x17U - (char)lVar57 & 0x1f) &
                                                          uVar78) + iVar73);
                                    goto LAB_0015417c;
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar47->huff_ac[lVar49].size[uVar50];
                                uVar78 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar47->code_bits) {
                                  psVar47->code_buffer = uVar64 << (bVar2 & 0x1f);
                                  psVar47->code_bits = psVar47->code_bits - (uint)bVar2;
LAB_0015417c:
                                  uVar78 = (uint)psVar47->huff_ac[lVar49].values[uVar50];
                                }
                              }
                              if ((int)uVar78 < 0) {
LAB_0015421e:
                                *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
                                bVar81 = false;
                              }
                              else {
                                uVar64 = uVar78 >> 4;
                                if ((uVar78 & 0xf) == 1) {
                                  if (psVar47->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar47);
                                  }
                                  uVar78 = psVar47->code_buffer;
                                  psVar47->code_buffer = uVar78 * 2;
                                  psVar47->code_bits = psVar47->code_bits + -1;
                                  sVar61 = (short)(((int)~uVar78 >> 0x1f | 1U) << (bVar39 & 0x1f));
                                }
                                else {
                                  if ((uVar78 & 0xf) != 0) goto LAB_0015421e;
                                  if (uVar78 < 0xf0) {
                                    psVar47->eob_run = ~(-1 << ((byte)uVar64 & 0x1f));
                                    uVar58 = 0x40;
                                    if (0xf < uVar78) {
                                      if (psVar47->code_bits < (int)uVar64) {
                                        stbi__grow_buffer_unsafe(psVar47);
                                      }
                                      bVar2 = (byte)uVar64 & 0x1f;
                                      uVar44 = psVar47->code_buffer << bVar2 |
                                               psVar47->code_buffer >> 0x20 - bVar2;
                                      uVar78 = stbi__bmask[uVar64];
                                      psVar47->code_buffer = ~uVar78 & uVar44;
                                      psVar47->code_bits = psVar47->code_bits - uVar64;
                                      psVar47->eob_run = psVar47->eob_run + (uVar44 & uVar78);
                                    }
                                  }
                                  else {
                                    uVar58 = 0xf;
                                  }
                                  uVar64 = uVar58;
                                  sVar61 = 0;
                                }
                                uVar63 = (ulong)(int)uVar63;
                                do {
                                  if ((long)psVar47->spec_end < (long)uVar63) break;
                                  bVar2 = ""[uVar63];
                                  if (psVar67[bVar2] == 0) {
                                    if (uVar64 == 0) {
                                      psVar67[bVar2] = sVar61;
                                      bVar81 = false;
                                      uVar64 = 0;
                                    }
                                    else {
                                      uVar64 = uVar64 - 1;
                                      bVar81 = true;
                                    }
                                  }
                                  else {
                                    if (psVar47->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar47);
                                    }
                                    sVar42 = psVar47->code_buffer;
                                    psVar47->code_buffer = sVar42 * 2;
                                    psVar47->code_bits = psVar47->code_bits + -1;
                                    bVar81 = true;
                                    if (((int)sVar42 < 0) &&
                                       (sVar3 = psVar67[bVar2], (uVar62 & (int)sVar3) == 0)) {
                                      uVar78 = uVar62;
                                      if (sVar3 < 1) {
                                        uVar78 = -uVar62;
                                      }
                                      psVar67[bVar2] = sVar3 + (short)uVar78;
                                    }
                                  }
                                  uVar63 = uVar63 + 1;
                                } while (bVar81);
                                bVar81 = true;
                              }
                              if (!bVar81) {
                                bVar56 = false;
                                goto LAB_0015433b;
                              }
                            } while ((int)uVar63 <= psVar47->spec_end);
                          }
                          else {
                            psVar47->eob_run = iVar41 + -1;
                            if (psVar47->spec_start <= psVar47->spec_end) {
                              uVar62 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                              do {
                                bVar39 = ""[uVar63];
                                if (psVar67[bVar39] != 0) {
                                  if (psVar47->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar47);
                                  }
                                  sVar42 = psVar47->code_buffer;
                                  psVar47->code_buffer = sVar42 * 2;
                                  psVar47->code_bits = psVar47->code_bits + -1;
                                  if (((int)sVar42 < 0) &&
                                     (sVar61 = psVar67[bVar39], (uVar62 & (int)sVar61) == 0)) {
                                    uVar64 = -uVar62;
                                    if (0 < sVar61) {
                                      uVar64 = uVar62;
                                    }
                                    psVar67[bVar39] = (short)uVar64 + sVar61;
                                  }
                                }
                                bVar81 = (long)uVar63 < (long)psVar47->spec_end;
                                uVar63 = uVar63 + 1;
                              } while (bVar81);
                            }
                          }
LAB_00154336:
                          bVar56 = true;
                        }
LAB_0015433b:
                        if (!bVar56) {
                          local_8960._0_4_ = 0;
                        }
                        local_8960 = (ulong)(uint)local_8960;
                        if (!bVar56) {
                          bVar81 = false;
                        }
                        else {
LAB_00154360:
                          iVar41 = psVar47->todo;
                          psVar47->todo = iVar41 + -1;
                          bVar81 = true;
                          if (iVar41 < 2) {
                            if (psVar47->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar47);
                            }
                            if ((psVar47->marker & 0xf8) == 0xd0) {
                              psVar47->code_buffer = 0;
                              psVar47->code_bits = 0;
                              psVar47->nomore = 0;
                              psVar47->img_comp[3].dc_pred = 0;
                              psVar47->img_comp[2].dc_pred = 0;
                              psVar47->img_comp[1].dc_pred = 0;
                              psVar47->img_comp[0].dc_pred = 0;
                              psVar47->marker = 0xff;
                              iVar41 = psVar47->restart_interval;
                              if (iVar41 == 0) {
                                iVar41 = 0x7fffffff;
                              }
                              psVar47->todo = iVar41;
                              psVar47->eob_run = 0;
                            }
                            else {
                              local_8960 = 1;
                              bVar81 = false;
                            }
                          }
                        }
                      }
                      if (!bVar81) {
                        iVar41 = (uint)local_8960;
                        goto LAB_00154ce4;
                      }
                      uVar63 = (ulong)(uVar79 + 1);
                      paVar59 = local_8910;
                    } while (uVar79 + 1 != uVar43);
                  }
                  uVar79 = (uint)uVar63;
                  iVar41 = 1;
                  local_8974 = local_8974 + 1;
                } while (local_8974 != local_8900);
              }
            }
            else {
              iVar41 = 1;
              if (0 < psVar47->img_mcu_y) {
                iVar41 = 0;
                do {
                  if (0 < psVar47->img_mcu_x) {
                    iVar73 = 0;
                    do {
                      if (0 < psVar47->scan_n) {
                        uVar50 = 0;
                        do {
                          local_89c8 = uVar50;
                          iVar71 = psVar47->order[local_89c8];
                          if (0 < psVar47->img_comp[iVar71].v) {
                            iVar72 = 0;
                            bVar81 = true;
                            do {
                              iVar45 = paVar1[iVar71].h;
                              if (0 < iVar45) {
                                iVar74 = 0;
                                do {
                                  iVar45 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar47,paVar1[iVar71].coeff +
                                                              (iVar45 * iVar73 + iVar74 +
                                                              (paVar1[iVar71].v * iVar41 + iVar72) *
                                                              paVar1[iVar71].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar47->huff_dc[paVar1[iVar71].hd].fast,
                                                      iVar71);
                                  uVar79 = (uint)extraout_RDX_08;
                                  uVar63 = extraout_RDX_08;
                                  if (iVar45 == 0) {
                                    if (bVar81) goto LAB_00154cc7;
                                    goto LAB_001549c6;
                                  }
                                  iVar74 = iVar74 + 1;
                                  iVar45 = paVar1[iVar71].h;
                                } while (iVar74 < iVar45);
                              }
                              iVar72 = iVar72 + 1;
                              bVar81 = iVar72 < paVar1[iVar71].v;
                            } while (iVar72 < paVar1[iVar71].v);
                          }
LAB_001549c6:
                          uVar50 = local_89c8 + 1;
                        } while ((long)(local_89c8 + 1) < (long)psVar47->scan_n);
                      }
                      uVar79 = (uint)uVar63;
                      iVar71 = psVar47->todo;
                      psVar47->todo = iVar71 + -1;
                      if (iVar71 < 2) {
                        if (psVar47->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar47);
                          uVar79 = extraout_EDX_01;
                        }
                        if ((psVar47->marker & 0xf8) != 0xd0) goto LAB_00154a8b;
                        psVar47->code_buffer = 0;
                        psVar47->code_bits = 0;
                        psVar47->nomore = 0;
                        psVar47->img_comp[3].dc_pred = 0;
                        psVar47->img_comp[2].dc_pred = 0;
                        psVar47->img_comp[1].dc_pred = 0;
                        psVar47->img_comp[0].dc_pred = 0;
                        psVar47->marker = 0xff;
                        iVar71 = psVar47->restart_interval;
                        uVar63 = 0x7fffffff;
                        if (iVar71 == 0) {
                          iVar71 = 0x7fffffff;
                        }
                        psVar47->todo = iVar71;
                        psVar47->eob_run = 0;
                      }
                      iVar73 = iVar73 + 1;
                    } while (iVar73 < psVar47->img_mcu_x);
                  }
                  uVar79 = (uint)uVar63;
                  iVar41 = iVar41 + 1;
                } while (iVar41 < psVar47->img_mcu_y);
                goto LAB_00154a8b;
              }
            }
            goto LAB_00154ce4;
          }
LAB_00154f0d:
          uVar79 = (uint)paVar59;
          *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
        }
        else {
          if (bVar39 == 0xdc) {
            iVar41 = stbi__get16be(psVar47->s);
            sVar42 = stbi__get16be(psVar47->s);
            paVar59 = extraout_RDX;
            if ((iVar41 == 4) && (sVar42 == psVar47->s->img_y)) goto LAB_00154cf6;
            goto LAB_00154f0d;
          }
          if (bVar39 == 0xd9) {
            if ((psVar47->progressive != 0) && (0 < psVar47->s->img_n)) {
              lVar49 = 0;
              do {
                iVar41 = psVar47->img_comp[lVar49].y + 7 >> 3;
                if (0 < iVar41) {
                  uVar79 = paVar1[lVar49].x + 7 >> 3;
                  iVar73 = 0;
                  do {
                    if (0 < (int)uVar79) {
                      uVar63 = 0;
                      do {
                        psVar67 = paVar1[lVar49].coeff +
                                  (paVar1[lVar49].coeff_w * iVar73 + (int)uVar63) * 0x40;
                        iVar71 = paVar1[lVar49].tq;
                        lVar57 = 0;
                        do {
                          psVar67[lVar57] = psVar67[lVar57] * psVar47->dequant[iVar71][lVar57];
                          lVar57 = lVar57 + 1;
                        } while (lVar57 != 0x40);
                        (*psVar47->idct_block_kernel)
                                  (paVar1[lVar49].data +
                                   uVar63 * 8 + (long)(iVar73 * 8 * paVar1[lVar49].w2),
                                   paVar1[lVar49].w2,psVar67);
                        uVar63 = uVar63 + 1;
                      } while (uVar63 != uVar79);
                    }
                    iVar73 = iVar73 + 1;
                  } while (iVar73 != iVar41);
                }
                lVar49 = lVar49 + 1;
              } while (lVar49 < psVar47->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar47->s->img_n) * 2 + 1;
            }
            uVar79 = psVar47->s->img_n;
            if (uVar79 == 3) {
              bVar81 = true;
              if (psVar47->rgb != 3) {
                if (psVar47->app14_color_transform != 0) goto LAB_0015558d;
                bVar81 = psVar47->jfif == 0;
              }
            }
            else {
LAB_0015558d:
              bVar81 = false;
            }
            uVar43 = 1;
            if (bVar81) {
              uVar43 = uVar79;
            }
            if (2 < req_comp) {
              uVar43 = uVar79;
            }
            if (uVar79 != 3) {
              uVar43 = uVar79;
            }
            _local_8938 = (undefined1  [16])0x0;
            _local_8948 = (undefined1  [16])0x0;
            if (0 < (int)uVar43) {
              lVar49 = 0;
              while( true ) {
                psVar53 = psVar47->s;
                sVar42 = psVar53->img_x;
                pvVar51 = malloc((ulong)(sVar42 + 3));
                *(void **)((long)&psVar47->img_comp[0].linebuf + lVar49 * 2) = pvVar51;
                if (pvVar51 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar47,psVar53->img_n,why);
                  *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
                }
                else {
                  uVar63 = (long)psVar47->img_h_max /
                           (long)*(int *)((long)&psVar47->img_comp[0].h + lVar49 * 2);
                  iVar41 = (int)uVar63;
                  *(int *)((long)(local_88a8.pal + -7) + lVar49) = iVar41;
                  iVar73 = psVar47->img_v_max / *(int *)((long)&psVar47->img_comp[0].v + lVar49 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar49) = iVar73;
                  *(int *)((long)(local_88a8.pal + -4) + lVar49) = iVar73 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar49) =
                       (int)((ulong)((sVar42 + iVar41) - 1) / (uVar63 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar49) = 0;
                  uVar7 = *(undefined8 *)((long)&psVar47->img_comp[0].data + lVar49 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar49) = uVar7;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar49) = uVar7;
                  if ((iVar41 == 1) && (iVar73 == 1)) {
                    pcVar52 = resample_row_1;
                  }
                  else if ((iVar41 == 1) && (iVar73 == 2)) {
                    pcVar52 = stbi__resample_row_v_2;
                  }
                  else if ((iVar41 == 2) && (iVar73 == 1)) {
                    pcVar52 = stbi__resample_row_h_2;
                  }
                  else if ((iVar41 == 2) && (iVar73 == 2)) {
                    pcVar52 = psVar47->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar52 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar49) = pcVar52;
                }
                if (pvVar51 == (void *)0x0) break;
                lVar49 = lVar49 + 0x30;
                if ((ulong)uVar43 * 0x30 == lVar49) goto LAB_0015570b;
              }
              goto LAB_00154f2d;
            }
LAB_0015570b:
            psVar76 = psVar47->s;
            sVar42 = psVar76->img_y;
            psVar53 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar76->img_x,sVar42,1);
            iVar41 = (int)extraout_RDX_11;
            if (psVar53 == (stbi__context *)0x0) {
              stbi__free_jpeg_components(psVar47,psVar76->img_n,iVar41);
              *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
              goto LAB_00154f2d;
            }
            if (sVar42 != 0) {
              iVar73 = 0;
              uVar79 = 0;
              psVar60 = extraout_RDX_11;
              do {
                sVar42 = psVar76->img_x;
                if (0 < (int)uVar43) {
                  pasVar75 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar63 = 0;
                  piVar77 = &psVar47->img_comp[0].y;
                  do {
                    asVar5 = pasVar75[-1];
                    asVar6 = pasVar75[-3];
                    iVar41 = (int)asVar6 >> 1;
                    auVar121 = (**(code **)(pasVar75 + -10))
                                         (*(stbi_uc **)(piVar77 + 10),
                                          *(undefined8 *)
                                           (*pasVar75 +
                                           ((ulong)(iVar41 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar75 +
                                               ((ulong)((int)asVar5 < iVar41) << 3 |
                                               0xffffffffffffffe0)),pasVar75[-2]);
                    psVar60 = auVar121._8_8_;
                    *(long *)(local_8948 + uVar63 * 8) = auVar121._0_8_;
                    pasVar75[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar75[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar75 + -8) = *(stbi_uc **)(pasVar75 + -6);
                      asVar5 = *pasVar75;
                      *pasVar75 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar77) {
                        *(stbi_uc **)(pasVar75 + -6) = *(stbi_uc **)(pasVar75 + -6) + piVar77[1];
                      }
                    }
                    uVar63 = uVar63 + 1;
                    piVar77 = piVar77 + 0x18;
                    pasVar75 = pasVar75 + 0xc;
                  } while (uVar43 != uVar63);
                }
                if (req_comp < 3) {
                  psVar76 = psVar47->s;
                  if (bVar81) {
                    if (req_comp == 1) {
                      if (psVar76->img_x != 0) {
                        uVar63 = 0;
                        do {
                          bVar39 = *(byte *)(local_8938._0_8_ + uVar63);
                          psVar53->buffer_start[uVar63 + sVar42 * iVar73 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)stack0xffffffffffff76c0[uVar63] * 0x96 +
                                         (uint)*(byte *)(local_8948._0_8_ + uVar63) * 0x4d >> 8);
                          uVar63 = uVar63 + 1;
                          psVar60 = stack0xffffffffffff76c0;
                        } while (uVar63 < psVar76->img_x);
                      }
                    }
                    else if (psVar76->img_x != 0) {
                      uVar63 = 0;
                      do {
                        bVar39 = *(byte *)(local_8938._0_8_ + uVar63);
                        psVar53->buffer_start[uVar63 * 2 + (ulong)(sVar42 * iVar73) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)stack0xffffffffffff76c0[uVar63] * 0x96 +
                                       (uint)*(byte *)(local_8948._0_8_ + uVar63) * 0x4d >> 8);
                        psVar53->buffer_start[uVar63 * 2 + (ulong)(sVar42 * iVar73) + -0x37] = 0xff;
                        uVar63 = uVar63 + 1;
                        psVar60 = stack0xffffffffffff76c0;
                      } while (uVar63 < psVar76->img_x);
                    }
                  }
                  else if (psVar76->img_n == 4) {
                    if (psVar47->app14_color_transform == 2) {
                      if (psVar76->img_x != 0) {
                        psVar65 = psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x37);
                        uVar63 = 0;
                        do {
                          iVar41 = (*(byte *)(local_8948._0_8_ + uVar63) ^ 0xff) *
                                   (uint)stack0xffffffffffff76d0[uVar63];
                          psVar65[-1] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar60 = stack0xffffffffffff76d0;
                        } while (uVar63 < psVar76->img_x);
                      }
                    }
                    else {
                      if (psVar47->app14_color_transform != 0) goto LAB_00155b5e;
                      if (psVar76->img_x != 0) {
                        psVar65 = psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x37);
                        uVar63 = 0;
                        do {
                          bVar39 = stack0xffffffffffff76d0[uVar63];
                          iVar41 = (uint)*(byte *)(local_8948._0_8_ + uVar63) * (uint)bVar39;
                          iVar71 = (uint)stack0xffffffffffff76c0[uVar63] * (uint)bVar39;
                          psVar65[-1] = (char)(((uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                                (uint)bVar39 +
                                                ((uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                                 (uint)bVar39 + 0x80 >> 8) + 0x80 >> 8 & 0xff) *
                                               0x1d + (iVar71 + (iVar71 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x96 +
                                                      (iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x4d >> 8);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar60 = (stbi_uc *)local_8948._0_8_;
                        } while (uVar63 < psVar76->img_x);
                      }
                    }
                  }
                  else {
LAB_00155b5e:
                    uVar62 = psVar76->img_x;
                    psVar60 = (stbi_uc *)(ulong)uVar62;
                    if (req_comp == 1) {
                      if (uVar62 != 0) {
                        psVar60 = (stbi_uc *)0x0;
                        do {
                          (psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x38))[(long)psVar60]
                               = *(stbi_uc *)(local_8948._0_8_ + (long)psVar60);
                          psVar60 = psVar60 + 1;
                        } while (psVar60 < (stbi_uc *)(ulong)psVar76->img_x);
                      }
                    }
                    else if (uVar62 != 0) {
                      psVar60 = (stbi_uc *)0x0;
                      do {
                        psVar53->buffer_start[(long)psVar60 * 2 + (ulong)(sVar42 * iVar73) + -0x38]
                             = *(stbi_uc *)(local_8948._0_8_ + (long)psVar60);
                        psVar53->buffer_start[(long)psVar60 * 2 + (ulong)(sVar42 * iVar73) + -0x37]
                             = 0xff;
                        psVar60 = psVar60 + 1;
                      } while (psVar60 < (stbi_uc *)(ulong)psVar76->img_x);
                    }
                  }
                }
                else {
                  psVar76 = psVar47->s;
                  if (psVar76->img_n == 3) {
                    if (bVar81) {
                      if (psVar76->img_x != 0) {
                        psVar65 = psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x35);
                        uVar63 = 0;
                        do {
                          psVar65[-3] = *(stbi_uc *)(local_8948._0_8_ + uVar63);
                          psVar65[-2] = stack0xffffffffffff76c0[uVar63];
                          psVar65[-1] = *(stbi_uc *)(local_8938._0_8_ + uVar63);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar60 = (stbi_uc *)local_8938._0_8_;
                        } while (uVar63 < psVar76->img_x);
                      }
                    }
                    else {
LAB_00155bd1:
                      (*psVar47->YCbCr_to_RGB_kernel)
                                (psVar53->buffer_start +
                                 ((ulong)(uVar79 * req_comp * sVar42) - 0x38),
                                 (stbi_uc *)local_8948._0_8_,stack0xffffffffffff76c0,
                                 (stbi_uc *)local_8938._0_8_,psVar76->img_x,req_comp);
                      psVar60 = extraout_RDX_12;
                    }
                  }
                  else if (psVar76->img_n == 4) {
                    if (psVar47->app14_color_transform == 2) {
                      (*psVar47->YCbCr_to_RGB_kernel)
                                (psVar53->buffer_start +
                                 ((ulong)(uVar79 * req_comp * sVar42) - 0x38),
                                 (stbi_uc *)local_8948._0_8_,stack0xffffffffffff76c0,
                                 (stbi_uc *)local_8938._0_8_,psVar76->img_x,req_comp);
                      psVar76 = psVar47->s;
                      psVar60 = extraout_RDX_13;
                      if (psVar76->img_x != 0) {
                        psVar65 = psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x36);
                        psVar60 = (stbi_uc *)0x0;
                        do {
                          bVar39 = psVar60[(long)stack0xffffffffffff76d0];
                          iVar41 = (psVar65[-2] ^ 0xff) * (uint)bVar39;
                          psVar65[-2] = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          iVar41 = (psVar65[-1] ^ 0xff) * (uint)bVar39;
                          psVar65[-1] = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          iVar41 = (*psVar65 ^ 0xff) * (uint)bVar39;
                          *psVar65 = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          psVar60 = psVar60 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                        } while (psVar60 < (stbi_uc *)(ulong)psVar76->img_x);
                      }
                    }
                    else {
                      if (psVar47->app14_color_transform != 0) goto LAB_00155bd1;
                      if (psVar76->img_x != 0) {
                        psVar65 = psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x35);
                        uVar63 = 0;
                        do {
                          bVar39 = stack0xffffffffffff76d0[uVar63];
                          iVar41 = (uint)*(byte *)(local_8948._0_8_ + uVar63) * (uint)bVar39;
                          psVar65[-3] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          iVar41 = (uint)stack0xffffffffffff76c0[uVar63] * (uint)bVar39;
                          psVar65[-2] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                          psVar65[-1] = (char)(((uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                                (uint)bVar39 + 0x80 >> 8) +
                                               (uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                               (uint)bVar39 + 0x80 >> 8);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar60 = stack0xffffffffffff76c0;
                        } while (uVar63 < psVar76->img_x);
                      }
                    }
                  }
                  else if (psVar76->img_x != 0) {
                    psVar66 = psVar53->buffer_start + ((ulong)(sVar42 * iVar73) - 0x35);
                    psVar65 = (stbi_uc *)0x0;
                    do {
                      sVar38 = *(stbi_uc *)(local_8948._0_8_ + (long)psVar65);
                      psVar66[-1] = sVar38;
                      psVar66[-2] = sVar38;
                      psVar66[-3] = sVar38;
                      *psVar66 = 0xff;
                      psVar65 = psVar65 + 1;
                      psVar60 = (stbi_uc *)(ulong)psVar76->img_x;
                      psVar66 = psVar66 + (uint)req_comp;
                    } while (psVar65 < psVar60);
                  }
                }
                iVar41 = (int)psVar60;
                uVar79 = uVar79 + 1;
                psVar76 = psVar47->s;
                iVar73 = iVar73 + req_comp;
              } while (uVar79 < psVar76->img_y);
            }
            stbi__free_jpeg_components(psVar47,psVar76->img_n,iVar41);
            psVar76 = psVar47->s;
            *x = psVar76->img_x;
            *y = psVar76->img_y;
            if (local_8918 != (int *)0x0) {
              *local_8918 = (uint)(2 < psVar76->img_n) * 2 + 1;
            }
            goto LAB_00154f33;
          }
          iVar41 = stbi__process_marker(psVar47,(uint)bVar39);
          uVar79 = extraout_EDX_00;
          if (iVar41 != 0) goto LAB_00154cf6;
        }
      }
LAB_00154f1d:
      stbi__free_jpeg_components(psVar47,psVar47->s->img_n,uVar79);
    }
    else {
      *(char **)(in_FS_OFFSET + -0x10) = "Internal error";
    }
LAB_00154f2d:
    psVar53 = (stbi__context *)0x0;
LAB_00154f33:
    free(psVar47);
  }
  else {
    iVar41 = stbi__check_png_header(s);
    psVar65 = s->img_buffer_original;
    s->img_buffer = psVar65;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar41 == 0) {
      if (psVar65 < s->img_buffer_original_end) {
LAB_00154f71:
        s->img_buffer = psVar65 + 1;
        if (*psVar65 == 'B') {
          psVar65 = s->img_buffer;
          if (s->img_buffer_end <= psVar65) {
            if (s->read_from_callbacks == 0) goto LAB_001551b2;
            psVar65 = s->buffer_start;
            iVar41 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
            if (iVar41 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar65;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar65;
              s->img_buffer_end = psVar65 + iVar41;
            }
            psVar65 = s->img_buffer;
          }
          s->img_buffer = psVar65 + 1;
          if (*psVar65 == 'M') {
            stbi__get16le(s);
            stbi__get16le(s);
            stbi__get16le(s);
            stbi__get16le(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar79 = stbi__get16le(s);
            iVar41 = stbi__get16le(s);
            uVar79 = iVar41 << 0x10 | uVar79;
            if ((((uVar79 < 0x39) && ((0x100010000001000U >> ((ulong)uVar79 & 0x3f) & 1) != 0)) ||
                (uVar79 == 0x7c)) || (uVar79 == 0x6c)) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              uStack_892c = 0xff;
              pvVar51 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8948);
              if (pvVar51 == (void *)0x0) goto LAB_001538d5;
              local_88dc = s->img_y;
              sVar42 = -local_88dc;
              if (0 < (int)local_88dc) {
                sVar42 = local_88dc;
              }
              s->img_y = sVar42;
              z_01 = local_8938._8_4_;
              uVar36 = local_8948._0_4_;
              uVar37 = local_8948._8_4_;
              if (local_8948._8_4_ == 0xc) {
                if (0x17 < (int)local_8948._0_4_) goto LAB_00155376;
                uVar79 = ((local_8948._4_4_ - local_8928) + -0x18) / 3;
LAB_0015536f:
                local_89c8 = (ulong)uVar79;
              }
              else {
                if ((int)local_8948._0_4_ < 0x10) {
                  uVar79 = local_8948._4_4_ - (local_8928 + local_8948._8_4_) >> 2;
                  goto LAB_0015536f;
                }
LAB_00155376:
                local_89c8 = 0;
              }
              uVar79 = uStack_893c;
              z = local_8938._0_4_;
              z_00 = local_8938._4_4_;
              uVar43 = uStack_892c;
              uVar62 = local_8938._8_4_ ^ 0xff000000;
              s->img_n = 4 - (uint)(local_8938._8_4_ == 0 || local_8948._0_4_ == 0x18 && uVar62 == 0
                                   );
              iVar41 = req_comp;
              if (req_comp < 3) {
                iVar41 = s->img_n;
              }
              sVar4 = s->img_x;
              iVar73 = stbi__mad3sizes_valid(iVar41,sVar4,sVar42,0);
              if (iVar73 == 0) {
LAB_00155454:
                pcVar48 = "Corrupt BMP";
                goto LAB_001538cc;
              }
              data_01 = (uchar *)stbi__malloc_mad3(iVar41,sVar4,sVar42,0);
              if (data_01 == (uchar *)0x0) {
                pcVar48 = "Out of memory";
                goto LAB_001538cc;
              }
              if ((int)uVar36 < 0x10) {
                iVar73 = (int)local_89c8;
                if (0x100 < iVar73 || iVar73 == 0) {
LAB_0015544f:
                  free(data_01);
                  goto LAB_00155454;
                }
                if (0 < iVar73) {
                  psVar60 = s->buffer_start;
                  psVar65 = s->buffer_start + 1;
                  uVar63 = 0;
                  do {
                    psVar66 = s->img_buffer;
                    if (psVar66 < s->img_buffer_end) {
LAB_00155f14:
                      s->img_buffer = psVar66 + 1;
                      sVar38 = *psVar66;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar71 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar65;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar60 + iVar71;
                        }
                        psVar66 = s->img_buffer;
                        goto LAB_00155f14;
                      }
                      sVar38 = '\0';
                    }
                    local_88a8.pal[uVar63 - 0xd][2] = sVar38;
                    psVar66 = s->img_buffer;
                    if (psVar66 < s->img_buffer_end) {
LAB_00155f8e:
                      s->img_buffer = psVar66 + 1;
                      sVar38 = *psVar66;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar71 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar65;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar60 + iVar71;
                        }
                        psVar66 = s->img_buffer;
                        goto LAB_00155f8e;
                      }
                      sVar38 = '\0';
                    }
                    local_88a8.pal[uVar63 - 0xd][1] = sVar38;
                    psVar66 = s->img_buffer;
                    if (psVar66 < s->img_buffer_end) {
LAB_00156008:
                      s->img_buffer = psVar66 + 1;
                      sVar38 = *psVar66;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar71 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar65;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar60 + iVar71;
                        }
                        psVar66 = s->img_buffer;
                        goto LAB_00156008;
                      }
                      sVar38 = '\0';
                    }
                    local_88a8.pal[uVar63 - 0xd][0] = sVar38;
                    if (uVar37 != 0xc) {
                      psVar66 = s->img_buffer;
                      if (s->img_buffer_end <= psVar66) {
                        if (s->read_from_callbacks == 0) goto LAB_0015608e;
                        iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar71 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar65;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar60;
                          s->img_buffer_end = psVar60 + iVar71;
                        }
                        psVar66 = s->img_buffer;
                      }
                      s->img_buffer = psVar66 + 1;
                    }
LAB_0015608e:
                    local_88a8.pal[uVar63 - 0xd][3] = 0xff;
                    uVar63 = uVar63 + 1;
                  } while (local_89c8 != uVar63);
                }
                stbi__skip(s,(iVar73 * (uVar37 == 0xc | 0xfffffffc) + local_8948._4_4_) -
                             (uVar37 + local_8928));
                if (uVar36 == 8) {
                  uVar79 = s->img_x;
                }
                else if (uVar36 == 4) {
                  uVar79 = s->img_x + 1 >> 1;
                }
                else {
                  if (uVar36 != 1) goto LAB_0015544f;
                  uVar79 = s->img_x + 7 >> 3;
                }
                local_8990 = -uVar79 & 3;
                if (uVar36 == 1) {
                  if (0 < (int)s->img_y) {
                    psVar60 = s->buffer_start;
                    iVar73 = 0;
                    iVar71 = 0;
                    do {
                      pbVar55 = s->img_buffer;
                      if (pbVar55 < s->img_buffer_end) {
LAB_0015707a:
                        s->img_buffer = pbVar55 + 1;
                        uVar79 = (uint)*pbVar55;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar72 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar60;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar60;
                            s->img_buffer_end = psVar60 + iVar72;
                          }
                          pbVar55 = s->img_buffer;
                          goto LAB_0015707a;
                        }
                        uVar79 = 0;
                      }
                      uVar62 = 7;
                      sVar42 = 1;
                      do {
                        sVar4 = s->img_x;
                        if ((int)sVar4 <= (int)(sVar42 - 1)) break;
                        uVar63 = (ulong)((uVar79 >> (uVar62 & 0x1f) & 1) != 0);
                        data_01[iVar73] = local_88a8.pal[uVar63 - 0xd][0];
                        data_01[(long)iVar73 + 1] = local_88a8.pal[uVar63 - 0xd][1];
                        data_01[(long)iVar73 + 2] = local_88a8.pal[uVar63 - 0xd][2];
                        iVar72 = iVar73 + 3;
                        if (iVar41 == 4) {
                          data_01[(long)iVar73 + 3] = 0xff;
                          iVar72 = iVar73 + 4;
                        }
                        iVar73 = iVar72;
                        if (sVar42 != sVar4) {
                          if ((int)uVar62 < 1) {
                            pbVar55 = s->img_buffer;
                            if (pbVar55 < s->img_buffer_end) {
LAB_00157189:
                              s->img_buffer = pbVar55 + 1;
                              uVar79 = (uint)*pbVar55;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                                if (iVar72 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = s->buffer_start + 1;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = psVar60 + iVar72;
                                }
                                pbVar55 = s->img_buffer;
                                goto LAB_00157189;
                              }
                              uVar79 = 0;
                            }
                            uVar62 = 7;
                          }
                          else {
                            uVar62 = uVar62 - 1;
                          }
                        }
                        bVar81 = sVar42 != sVar4;
                        sVar42 = sVar42 + 1;
                      } while (bVar81);
                      stbi__skip(s,local_8990);
                      iVar71 = iVar71 + 1;
                    } while (iVar71 < (int)s->img_y);
                  }
                }
                else if (0 < (int)s->img_y) {
                  psVar60 = s->buffer_start;
                  uVar63 = 0;
                  iVar73 = 0;
                  do {
                    if (0 < (int)s->img_x) {
                      iVar71 = 0;
                      do {
                        pbVar55 = s->img_buffer;
                        if (pbVar55 < s->img_buffer_end) {
LAB_001572a0:
                          s->img_buffer = pbVar55 + 1;
                          uVar79 = (uint)*pbVar55;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                            if (iVar72 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar60;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar60;
                              s->img_buffer_end = psVar60 + iVar72;
                            }
                            pbVar55 = s->img_buffer;
                            goto LAB_001572a0;
                          }
                          uVar79 = 0;
                        }
                        uVar62 = uVar79 >> 4;
                        if (uVar36 != 4) {
                          uVar62 = uVar79;
                        }
                        uVar50 = (ulong)uVar62;
                        uVar79 = uVar79 & 0xf;
                        if (uVar36 != 4) {
                          uVar79 = 0;
                        }
                        lVar49 = (long)(int)uVar63;
                        uVar70 = lVar49 + 3;
                        data_01[lVar49] = local_88a8.pal[uVar50 - 0xd][0];
                        data_01[lVar49 + 1] = local_88a8.pal[uVar50 - 0xd][1];
                        data_01[lVar49 + 2] = local_88a8.pal[uVar50 - 0xd][2];
                        if (iVar41 == 4) {
                          data_01[lVar49 + 3] = 0xff;
                          uVar70 = (ulong)((int)uVar63 + 4);
                        }
                        sVar42 = s->img_x;
                        if (iVar71 + 1U == sVar42) {
LAB_001573f0:
                          uVar63 = uVar70 & 0xffffffff;
                        }
                        else {
                          if (uVar36 == 8) {
                            pbVar55 = s->img_buffer;
                            if (s->img_buffer_end <= pbVar55) {
                              if (s->read_from_callbacks == 0) {
                                uVar79 = 0;
                                goto LAB_001573ab;
                              }
                              iVar72 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                              if (iVar72 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar60;
                                s->img_buffer_end = s->buffer_start + 1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar60;
                                s->img_buffer_end = psVar60 + iVar72;
                              }
                              pbVar55 = s->img_buffer;
                            }
                            s->img_buffer = pbVar55 + 1;
                            uVar79 = (uint)*pbVar55;
                          }
LAB_001573ab:
                          lVar49 = (long)(int)uVar70;
                          uVar63 = lVar49 + 3;
                          uVar50 = (ulong)uVar79;
                          data_01[lVar49] = local_88a8.pal[uVar50 - 0xd][0];
                          data_01[lVar49 + 1] = local_88a8.pal[uVar50 - 0xd][1];
                          data_01[lVar49 + 2] = local_88a8.pal[uVar50 - 0xd][2];
                          if (iVar41 == 4) {
                            uVar70 = (ulong)((int)uVar70 + 4);
                            data_01[lVar49 + 3] = 0xff;
                            goto LAB_001573f0;
                          }
                        }
                      } while ((iVar71 + 1U != sVar42) &&
                              (iVar71 = iVar71 + 2, iVar71 < (int)s->img_x));
                    }
                    stbi__skip(s,local_8990);
                    iVar73 = iVar73 + 1;
                  } while (iVar73 < (int)s->img_y);
                }
              }
              else {
                uVar64 = local_8948._4_4_ - (uVar37 + local_8928);
                uVar63 = (ulong)uVar64;
                stbi__skip(s,uVar64);
                if (uVar36 == 0x18) {
                  iVar73 = -3;
LAB_001561b1:
                  uVar64 = iVar73 * s->img_x & 3;
                }
                else {
                  uVar64 = 0;
                  if (uVar36 == 0x10) {
                    iVar73 = -2;
                    goto LAB_001561b1;
                  }
                }
                iVar73 = 0;
                if (uVar36 == 0x18) {
                  uVar63 = 0;
LAB_00156201:
                  bVar81 = false;
                }
                else {
                  uVar68 = (undefined7)(uVar63 >> 8);
                  if (uVar36 != 0x20) {
                    uVar63 = CONCAT71(uVar68,1);
                    goto LAB_00156201;
                  }
                  bVar81 = (uVar79 == 0xff0000 && (z == 0xff00 && z_00 == 0xff)) && uVar62 == 0;
                  uVar63 = CONCAT71(uVar68,(uVar79 != 0xff0000 || (z != 0xff00 || z_00 != 0xff)) ||
                                           uVar62 != 0);
                }
                iVar71 = 0;
                local_8974 = 0;
                local_8904 = 0;
                uVar78 = 0;
                uVar58 = 0;
                uVar44 = 0;
                uVar62 = 0;
                local_88fc = (uint)uVar63;
                if ((char)uVar63 == '\0') {
LAB_001563fb:
                  bVar29 = true;
                  if (0 < (int)s->img_y) {
                    psVar60 = s->buffer_start;
                    local_88f8 = s->buffer_start + 1;
                    local_8910 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_8910._4_4_,-iVar73);
                    local_88f0 = (int *)CONCAT44(local_88f0._4_4_,8 - uVar78);
                    local_8900 = -iVar71;
                    local_88c4 = 8 - uVar58;
                    local_88c8 = -local_8974;
                    local_88cc = 8 - uVar44;
                    local_88d4 = -local_8904;
                    local_88d0 = 8 - uVar62;
                    iVar45 = 0;
                    local_88e8 = (ulong)(uVar78 << 2);
                    local_88b0 = (ulong)(uVar58 << 2);
                    local_88b8 = (ulong)(uVar44 << 2);
                    local_88c0 = (ulong)(uVar62 << 2);
                    iVar72 = 0;
                    local_8908 = uVar64;
                    do {
                      local_88d8 = iVar72;
                      if ((char)uVar63 == '\0') {
                        if (0 < (int)s->img_x) {
                          iVar72 = 0;
                          do {
                            puVar54 = s->img_buffer;
                            if (puVar54 < s->img_buffer_end) {
LAB_001566ea:
                              s->img_buffer = puVar54 + 1;
                              uVar40 = *puVar54;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar74 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                                if (iVar74 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = local_88f8;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = psVar60 + iVar74;
                                }
                                puVar54 = s->img_buffer;
                                goto LAB_001566ea;
                              }
                              uVar40 = '\0';
                            }
                            data_01[(long)iVar45 + 2] = uVar40;
                            puVar54 = s->img_buffer;
                            if (puVar54 < s->img_buffer_end) {
LAB_00156784:
                              s->img_buffer = puVar54 + 1;
                              uVar40 = *puVar54;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar74 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                                if (iVar74 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = local_88f8;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = psVar60 + iVar74;
                                }
                                puVar54 = s->img_buffer;
                                goto LAB_00156784;
                              }
                              uVar40 = '\0';
                            }
                            data_01[(long)iVar45 + 1] = uVar40;
                            puVar54 = s->img_buffer;
                            if (puVar54 < s->img_buffer_end) {
LAB_0015681b:
                              s->img_buffer = puVar54 + 1;
                              uVar40 = *puVar54;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar74 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                                if (iVar74 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = local_88f8;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = psVar60 + iVar74;
                                }
                                puVar54 = s->img_buffer;
                                goto LAB_0015681b;
                              }
                              uVar40 = '\0';
                            }
                            data_01[iVar45] = uVar40;
                            bVar39 = 0xff;
                            if (bVar81) {
                              pbVar55 = s->img_buffer;
                              if (s->img_buffer_end <= pbVar55) {
                                if (s->read_from_callbacks == 0) {
                                  bVar39 = 0;
                                  goto LAB_001568cb;
                                }
                                iVar74 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                                if (iVar74 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = local_88f8;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar60;
                                  s->img_buffer_end = psVar60 + iVar74;
                                }
                                pbVar55 = s->img_buffer;
                              }
                              s->img_buffer = pbVar55 + 1;
                              bVar39 = *pbVar55;
                            }
LAB_001568cb:
                            iVar74 = iVar45 + 3;
                            if (iVar41 == 4) {
                              data_01[(long)iVar45 + 3] = bVar39;
                              iVar74 = iVar45 + 4;
                            }
                            iVar45 = iVar74;
                            uVar43 = uVar43 | bVar39;
                            iVar72 = iVar72 + 1;
                          } while (iVar72 < (int)s->img_x);
                        }
                      }
                      else if (0 < (int)s->img_x) {
                        iVar72 = 0;
                        do {
                          uVar62 = stbi__get16le(s);
                          if (uVar36 != 0x10) {
                            iVar74 = stbi__get16le(s);
                            uVar62 = uVar62 | iVar74 << 0x10;
                          }
                          uVar64 = (uVar62 & uVar79) >> ((byte)iVar73 & 0x1f);
                          if (iVar73 < 0) {
                            uVar64 = (uVar62 & uVar79) << ((byte)local_8910 & 0x1f);
                          }
                          uVar78 = (uVar62 & z) >> ((byte)iVar71 & 0x1f);
                          if (iVar71 < 0) {
                            uVar78 = (uVar62 & z) << ((byte)local_8900 & 0x1f);
                          }
                          iVar74 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                           local_88b0);
                          bVar39 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                          uVar58 = (uVar62 & z_00) >> ((byte)local_8974 & 0x1f);
                          if (local_8974 < 0) {
                            uVar58 = (uVar62 & z_00) << ((byte)local_88c8 & 0x1f);
                          }
                          iVar120 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_88b8);
                          bVar2 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8];
                          data_01[iVar45] =
                               (uchar)((int)((uVar64 >> ((byte)local_88f0 & 0x1f)) *
                                            *(int *)(stbi__shiftsigned(unsigned_int,int,int)::
                                                     mul_table + local_88e8)) >>
                                      (stbi__shiftsigned(unsigned_int,int,int)::shift_table
                                       [local_88e8] & 0x1f));
                          data_01[(long)iVar45 + 1] =
                               (uchar)((int)((uVar78 >> ((byte)local_88c4 & 0x1f)) * iVar74) >>
                                      (bVar39 & 0x1f));
                          data_01[(long)iVar45 + 2] =
                               (uchar)((int)((uVar58 >> ((byte)local_88cc & 0x1f)) * iVar120) >>
                                      (bVar2 & 0x1f));
                          if (z_01 == 0) {
                            uVar62 = 0xff;
                          }
                          else {
                            uVar64 = (uVar62 & z_01) >> ((byte)local_8904 & 0x1f);
                            if (local_8904 < 0) {
                              uVar64 = (uVar62 & z_01) << ((byte)local_88d4 & 0x1f);
                            }
                            uVar62 = (int)((uVar64 >> ((byte)local_88d0 & 0x1f)) *
                                          *(int *)(stbi__shiftsigned(unsigned_int,int,int)::
                                                   mul_table + local_88c0)) >>
                                     (stbi__shiftsigned(unsigned_int,int,int)::shift_table
                                      [local_88c0] & 0x1f);
                          }
                          iVar74 = iVar45 + 3;
                          if (iVar41 == 4) {
                            data_01[(long)iVar45 + 3] = (uchar)uVar62;
                            iVar74 = iVar45 + 4;
                          }
                          iVar45 = iVar74;
                          uVar43 = uVar43 | uVar62;
                          iVar72 = iVar72 + 1;
                        } while (iVar72 < (int)s->img_x);
                      }
                      stbi__skip(s,local_8908);
                      iVar72 = local_88d8 + 1;
                      uVar63 = (ulong)local_88fc;
                    } while (iVar72 < (int)s->img_y);
                    bVar29 = true;
                  }
                }
                else {
                  if ((z != 0 && uVar79 != 0) && z_00 != 0) {
                    local_8908 = uVar64;
                    iVar73 = stbi__high_bit(uVar79);
                    iVar73 = iVar73 + -7;
                    uVar62 = (uVar79 >> 1 & 0x55555555) + (uVar79 & 0x55555555);
                    uVar62 = (uVar62 >> 2 & 0x33333333) + (uVar62 & 0x33333333);
                    uVar62 = (uVar62 >> 4) + uVar62 & 0xf0f0f0f;
                    uVar62 = (uVar62 >> 8) + uVar62;
                    uVar78 = (uVar62 >> 0x10) + uVar62 & 0xff;
                    iVar71 = stbi__high_bit(z);
                    iVar71 = iVar71 + -7;
                    uVar62 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
                    uVar62 = (uVar62 >> 2 & 0x33333333) + (uVar62 & 0x33333333);
                    uVar62 = (uVar62 >> 4) + uVar62 & 0xf0f0f0f;
                    uVar62 = (uVar62 >> 8) + uVar62;
                    uVar58 = (uVar62 >> 0x10) + uVar62 & 0xff;
                    local_8974 = stbi__high_bit(z_00);
                    local_8974 = local_8974 + -7;
                    uVar62 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
                    uVar62 = (uVar62 >> 2 & 0x33333333) + (uVar62 & 0x33333333);
                    uVar62 = (uVar62 >> 4) + uVar62 & 0xf0f0f0f;
                    uVar62 = (uVar62 >> 8) + uVar62;
                    uVar44 = (uVar62 >> 0x10) + uVar62 & 0xff;
                    local_8904 = stbi__high_bit(z_01);
                    uVar63 = (ulong)local_88fc;
                    local_8904 = local_8904 + -7;
                    uVar62 = ((uint)z_01 >> 1 & 0x55555555) + (z_01 & 0x55555555);
                    uVar62 = (uVar62 >> 2 & 0x33333333) + (uVar62 & 0x33333333);
                    uVar62 = (uVar62 >> 4) + uVar62 & 0xf0f0f0f;
                    uVar62 = (uVar62 >> 8) + uVar62;
                    uVar62 = (uVar62 >> 0x10) + uVar62 & 0xff;
                    uVar64 = local_8908;
                    goto LAB_001563fb;
                  }
                  free(data_01);
                  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt BMP";
                  bVar29 = false;
                }
                if (!bVar29) goto LAB_001538d5;
              }
              auVar35 = _DAT_001ec6a0;
              auVar34 = _DAT_001ec690;
              auVar33 = _DAT_001ec680;
              auVar32 = _DAT_001ec670;
              auVar31 = _DAT_001ec660;
              auVar30 = _DAT_001ec650;
              auVar121 = _DAT_001ec3b0;
              if (((iVar41 == 4) && (uVar43 == 0)) &&
                 (uVar79 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar79)) {
                uVar43 = uVar79 >> 2;
                auVar82._4_4_ = 0;
                auVar82._0_4_ = uVar43;
                auVar82._8_4_ = uVar43;
                auVar82._12_4_ = 0;
                puVar54 = data_01 + uVar79;
                uVar63 = 0;
                do {
                  auVar100._8_4_ = (int)uVar63;
                  auVar100._0_8_ = uVar63;
                  auVar100._12_4_ = (int)(uVar63 >> 0x20);
                  auVar102 = auVar82 | auVar121;
                  auVar104 = (auVar100 | auVar35) ^ auVar121;
                  iVar73 = auVar102._0_4_;
                  iVar74 = -(uint)(iVar73 < auVar104._0_4_);
                  iVar71 = auVar102._4_4_;
                  auVar106._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
                  iVar72 = auVar102._8_4_;
                  iVar120 = -(uint)(iVar72 < auVar104._8_4_);
                  iVar45 = auVar102._12_4_;
                  auVar106._12_4_ = -(uint)(iVar45 < auVar104._12_4_);
                  auVar83._4_4_ = iVar74;
                  auVar83._0_4_ = iVar74;
                  auVar83._8_4_ = iVar120;
                  auVar83._12_4_ = iVar120;
                  auVar83 = pshuflw(in_XMM1,auVar83,0xe8);
                  auVar105._4_4_ = -(uint)(auVar104._4_4_ == iVar71);
                  auVar105._12_4_ = -(uint)(auVar104._12_4_ == iVar45);
                  auVar105._0_4_ = auVar105._4_4_;
                  auVar105._8_4_ = auVar105._12_4_;
                  auVar92 = pshuflw(in_XMM2,auVar105,0xe8);
                  auVar106._0_4_ = auVar106._4_4_;
                  auVar106._8_4_ = auVar106._12_4_;
                  auVar104 = pshuflw(auVar83,auVar106,0xe8);
                  auVar102._8_4_ = 0xffffffff;
                  auVar102._0_8_ = 0xffffffffffffffff;
                  auVar102._12_4_ = 0xffffffff;
                  auVar102 = (auVar104 | auVar92 & auVar83) ^ auVar102;
                  auVar102 = packssdw(auVar102,auVar102);
                  if ((auVar102 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *puVar54 = 0xff;
                  }
                  auVar92._4_4_ = iVar74;
                  auVar92._0_4_ = iVar74;
                  auVar92._8_4_ = iVar120;
                  auVar92._12_4_ = iVar120;
                  auVar106 = auVar105 & auVar92 | auVar106;
                  auVar102 = packssdw(auVar106,auVar106);
                  auVar104._8_4_ = 0xffffffff;
                  auVar104._0_8_ = 0xffffffffffffffff;
                  auVar104._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 ^ auVar104,auVar102 ^ auVar104);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._0_4_ >> 8 & 1) != 0) {
                    puVar54[-4] = 0xff;
                  }
                  auVar102 = (auVar100 | auVar34) ^ auVar121;
                  auVar93._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar93._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar93._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar93._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar107._4_4_ = auVar93._0_4_;
                  auVar107._0_4_ = auVar93._0_4_;
                  auVar107._8_4_ = auVar93._8_4_;
                  auVar107._12_4_ = auVar93._8_4_;
                  iVar74 = -(uint)(auVar102._4_4_ == iVar71);
                  iVar120 = -(uint)(auVar102._12_4_ == iVar45);
                  auVar17._4_4_ = iVar74;
                  auVar17._0_4_ = iVar74;
                  auVar17._8_4_ = iVar120;
                  auVar17._12_4_ = iVar120;
                  auVar117._4_4_ = auVar93._4_4_;
                  auVar117._0_4_ = auVar93._4_4_;
                  auVar117._8_4_ = auVar93._12_4_;
                  auVar117._12_4_ = auVar93._12_4_;
                  auVar102 = auVar17 & auVar107 | auVar117;
                  auVar102 = packssdw(auVar102,auVar102);
                  auVar8._8_4_ = 0xffffffff;
                  auVar8._0_8_ = 0xffffffffffffffff;
                  auVar8._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 ^ auVar8,auVar102 ^ auVar8);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._0_4_ >> 0x10 & 1) != 0) {
                    puVar54[-8] = 0xff;
                  }
                  auVar102 = pshufhw(auVar102,auVar107,0x84);
                  auVar18._4_4_ = iVar74;
                  auVar18._0_4_ = iVar74;
                  auVar18._8_4_ = iVar120;
                  auVar18._12_4_ = iVar120;
                  auVar104 = pshufhw(auVar93,auVar18,0x84);
                  auVar83 = pshufhw(auVar102,auVar117,0x84);
                  auVar84._8_4_ = 0xffffffff;
                  auVar84._0_8_ = 0xffffffffffffffff;
                  auVar84._12_4_ = 0xffffffff;
                  auVar84 = (auVar83 | auVar104 & auVar102) ^ auVar84;
                  auVar102 = packssdw(auVar84,auVar84);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._0_4_ >> 0x18 & 1) != 0) {
                    puVar54[-0xc] = 0xff;
                  }
                  auVar102 = (auVar100 | auVar33) ^ auVar121;
                  auVar94._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar94._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar94._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar94._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar19._4_4_ = auVar94._0_4_;
                  auVar19._0_4_ = auVar94._0_4_;
                  auVar19._8_4_ = auVar94._8_4_;
                  auVar19._12_4_ = auVar94._8_4_;
                  auVar104 = pshuflw(auVar117,auVar19,0xe8);
                  auVar85._0_4_ = -(uint)(auVar102._0_4_ == iVar73);
                  auVar85._4_4_ = -(uint)(auVar102._4_4_ == iVar71);
                  auVar85._8_4_ = -(uint)(auVar102._8_4_ == iVar72);
                  auVar85._12_4_ = -(uint)(auVar102._12_4_ == iVar45);
                  auVar108._4_4_ = auVar85._4_4_;
                  auVar108._0_4_ = auVar85._4_4_;
                  auVar108._8_4_ = auVar85._12_4_;
                  auVar108._12_4_ = auVar85._12_4_;
                  auVar102 = pshuflw(auVar85,auVar108,0xe8);
                  auVar109._4_4_ = auVar94._4_4_;
                  auVar109._0_4_ = auVar94._4_4_;
                  auVar109._8_4_ = auVar94._12_4_;
                  auVar109._12_4_ = auVar94._12_4_;
                  auVar83 = pshuflw(auVar94,auVar109,0xe8);
                  auVar9._8_4_ = 0xffffffff;
                  auVar9._0_8_ = 0xffffffffffffffff;
                  auVar9._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 & auVar104,(auVar83 | auVar102 & auVar104) ^ auVar9);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    puVar54[-0x10] = 0xff;
                  }
                  auVar20._4_4_ = auVar94._0_4_;
                  auVar20._0_4_ = auVar94._0_4_;
                  auVar20._8_4_ = auVar94._8_4_;
                  auVar20._12_4_ = auVar94._8_4_;
                  auVar109 = auVar108 & auVar20 | auVar109;
                  auVar83 = packssdw(auVar109,auVar109);
                  auVar10._8_4_ = 0xffffffff;
                  auVar10._0_8_ = 0xffffffffffffffff;
                  auVar10._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102,auVar83 ^ auVar10);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._4_2_ >> 8 & 1) != 0) {
                    puVar54[-0x14] = 0xff;
                  }
                  auVar102 = (auVar100 | auVar32) ^ auVar121;
                  auVar95._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar95._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar95._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar95._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar110._4_4_ = auVar95._0_4_;
                  auVar110._0_4_ = auVar95._0_4_;
                  auVar110._8_4_ = auVar95._8_4_;
                  auVar110._12_4_ = auVar95._8_4_;
                  iVar74 = -(uint)(auVar102._4_4_ == iVar71);
                  iVar120 = -(uint)(auVar102._12_4_ == iVar45);
                  auVar21._4_4_ = iVar74;
                  auVar21._0_4_ = iVar74;
                  auVar21._8_4_ = iVar120;
                  auVar21._12_4_ = iVar120;
                  auVar118._4_4_ = auVar95._4_4_;
                  auVar118._0_4_ = auVar95._4_4_;
                  auVar118._8_4_ = auVar95._12_4_;
                  auVar118._12_4_ = auVar95._12_4_;
                  auVar102 = auVar21 & auVar110 | auVar118;
                  auVar102 = packssdw(auVar102,auVar102);
                  auVar11._8_4_ = 0xffffffff;
                  auVar11._0_8_ = 0xffffffffffffffff;
                  auVar11._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 ^ auVar11,auVar102 ^ auVar11);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    puVar54[-0x18] = 0xff;
                  }
                  auVar102 = pshufhw(auVar102,auVar110,0x84);
                  auVar22._4_4_ = iVar74;
                  auVar22._0_4_ = iVar74;
                  auVar22._8_4_ = iVar120;
                  auVar22._12_4_ = iVar120;
                  auVar104 = pshufhw(auVar95,auVar22,0x84);
                  auVar83 = pshufhw(auVar102,auVar118,0x84);
                  auVar86._8_4_ = 0xffffffff;
                  auVar86._0_8_ = 0xffffffffffffffff;
                  auVar86._12_4_ = 0xffffffff;
                  auVar86 = (auVar83 | auVar104 & auVar102) ^ auVar86;
                  auVar102 = packssdw(auVar86,auVar86);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._6_2_ >> 8 & 1) != 0) {
                    puVar54[-0x1c] = 0xff;
                  }
                  auVar102 = (auVar100 | auVar31) ^ auVar121;
                  auVar96._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar96._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar96._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar96._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar23._4_4_ = auVar96._0_4_;
                  auVar23._0_4_ = auVar96._0_4_;
                  auVar23._8_4_ = auVar96._8_4_;
                  auVar23._12_4_ = auVar96._8_4_;
                  auVar104 = pshuflw(auVar118,auVar23,0xe8);
                  auVar87._0_4_ = -(uint)(auVar102._0_4_ == iVar73);
                  auVar87._4_4_ = -(uint)(auVar102._4_4_ == iVar71);
                  auVar87._8_4_ = -(uint)(auVar102._8_4_ == iVar72);
                  auVar87._12_4_ = -(uint)(auVar102._12_4_ == iVar45);
                  auVar111._4_4_ = auVar87._4_4_;
                  auVar111._0_4_ = auVar87._4_4_;
                  auVar111._8_4_ = auVar87._12_4_;
                  auVar111._12_4_ = auVar87._12_4_;
                  auVar102 = pshuflw(auVar87,auVar111,0xe8);
                  auVar112._4_4_ = auVar96._4_4_;
                  auVar112._0_4_ = auVar96._4_4_;
                  auVar112._8_4_ = auVar96._12_4_;
                  auVar112._12_4_ = auVar96._12_4_;
                  auVar83 = pshuflw(auVar96,auVar112,0xe8);
                  auVar97._8_4_ = 0xffffffff;
                  auVar97._0_8_ = 0xffffffffffffffff;
                  auVar97._12_4_ = 0xffffffff;
                  auVar97 = (auVar83 | auVar102 & auVar104) ^ auVar97;
                  auVar83 = packssdw(auVar97,auVar97);
                  auVar102 = packsswb(auVar102 & auVar104,auVar83);
                  if ((auVar102 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    puVar54[-0x20] = 0xff;
                  }
                  auVar24._4_4_ = auVar96._0_4_;
                  auVar24._0_4_ = auVar96._0_4_;
                  auVar24._8_4_ = auVar96._8_4_;
                  auVar24._12_4_ = auVar96._8_4_;
                  auVar112 = auVar111 & auVar24 | auVar112;
                  auVar83 = packssdw(auVar112,auVar112);
                  auVar12._8_4_ = 0xffffffff;
                  auVar12._0_8_ = 0xffffffffffffffff;
                  auVar12._12_4_ = 0xffffffff;
                  auVar83 = packssdw(auVar83 ^ auVar12,auVar83 ^ auVar12);
                  auVar102 = packsswb(auVar102,auVar83);
                  if ((auVar102._8_2_ >> 8 & 1) != 0) {
                    puVar54[-0x24] = 0xff;
                  }
                  auVar102 = (auVar100 | auVar30) ^ auVar121;
                  auVar98._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar98._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar98._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar98._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar113._4_4_ = auVar98._0_4_;
                  auVar113._0_4_ = auVar98._0_4_;
                  auVar113._8_4_ = auVar98._8_4_;
                  auVar113._12_4_ = auVar98._8_4_;
                  iVar74 = -(uint)(auVar102._4_4_ == iVar71);
                  iVar120 = -(uint)(auVar102._12_4_ == iVar45);
                  auVar25._4_4_ = iVar74;
                  auVar25._0_4_ = iVar74;
                  auVar25._8_4_ = iVar120;
                  auVar25._12_4_ = iVar120;
                  auVar119._4_4_ = auVar98._4_4_;
                  auVar119._0_4_ = auVar98._4_4_;
                  auVar119._8_4_ = auVar98._12_4_;
                  auVar119._12_4_ = auVar98._12_4_;
                  auVar102 = auVar25 & auVar113 | auVar119;
                  auVar102 = packssdw(auVar102,auVar102);
                  auVar13._8_4_ = 0xffffffff;
                  auVar13._0_8_ = 0xffffffffffffffff;
                  auVar13._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 ^ auVar13,auVar102 ^ auVar13);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    puVar54[-0x28] = 0xff;
                  }
                  auVar102 = pshufhw(auVar102,auVar113,0x84);
                  auVar26._4_4_ = iVar74;
                  auVar26._0_4_ = iVar74;
                  auVar26._8_4_ = iVar120;
                  auVar26._12_4_ = iVar120;
                  auVar104 = pshufhw(auVar98,auVar26,0x84);
                  auVar83 = pshufhw(auVar102,auVar119,0x84);
                  auVar88._8_4_ = 0xffffffff;
                  auVar88._0_8_ = 0xffffffffffffffff;
                  auVar88._12_4_ = 0xffffffff;
                  auVar88 = (auVar83 | auVar104 & auVar102) ^ auVar88;
                  auVar102 = packssdw(auVar88,auVar88);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._10_2_ >> 8 & 1) != 0) {
                    puVar54[-0x2c] = 0xff;
                  }
                  auVar102 = (auVar100 | _DAT_001ec640) ^ auVar121;
                  auVar99._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar99._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar99._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar99._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar27._4_4_ = auVar99._0_4_;
                  auVar27._0_4_ = auVar99._0_4_;
                  auVar27._8_4_ = auVar99._8_4_;
                  auVar27._12_4_ = auVar99._8_4_;
                  auVar104 = pshuflw(auVar119,auVar27,0xe8);
                  auVar89._0_4_ = -(uint)(auVar102._0_4_ == iVar73);
                  auVar89._4_4_ = -(uint)(auVar102._4_4_ == iVar71);
                  auVar89._8_4_ = -(uint)(auVar102._8_4_ == iVar72);
                  auVar89._12_4_ = -(uint)(auVar102._12_4_ == iVar45);
                  auVar114._4_4_ = auVar89._4_4_;
                  auVar114._0_4_ = auVar89._4_4_;
                  auVar114._8_4_ = auVar89._12_4_;
                  auVar114._12_4_ = auVar89._12_4_;
                  auVar102 = pshuflw(auVar89,auVar114,0xe8);
                  auVar115._4_4_ = auVar99._4_4_;
                  auVar115._0_4_ = auVar99._4_4_;
                  auVar115._8_4_ = auVar99._12_4_;
                  auVar115._12_4_ = auVar99._12_4_;
                  auVar83 = pshuflw(auVar99,auVar115,0xe8);
                  auVar14._8_4_ = 0xffffffff;
                  auVar14._0_8_ = 0xffffffffffffffff;
                  auVar14._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 & auVar104,(auVar83 | auVar102 & auVar104) ^ auVar14)
                  ;
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    puVar54[-0x30] = 0xff;
                  }
                  auVar28._4_4_ = auVar99._0_4_;
                  auVar28._0_4_ = auVar99._0_4_;
                  auVar28._8_4_ = auVar99._8_4_;
                  auVar28._12_4_ = auVar99._8_4_;
                  auVar115 = auVar114 & auVar28 | auVar115;
                  auVar83 = packssdw(auVar115,auVar115);
                  auVar15._8_4_ = 0xffffffff;
                  auVar15._0_8_ = 0xffffffffffffffff;
                  auVar15._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102,auVar83 ^ auVar15);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102._12_2_ >> 8 & 1) != 0) {
                    puVar54[-0x34] = 0xff;
                  }
                  auVar102 = (auVar100 | _DAT_001ec630) ^ auVar121;
                  auVar90._0_4_ = -(uint)(iVar73 < auVar102._0_4_);
                  auVar90._4_4_ = -(uint)(iVar71 < auVar102._4_4_);
                  auVar90._8_4_ = -(uint)(iVar72 < auVar102._8_4_);
                  auVar90._12_4_ = -(uint)(iVar45 < auVar102._12_4_);
                  auVar116._4_4_ = auVar90._0_4_;
                  auVar116._0_4_ = auVar90._0_4_;
                  auVar116._8_4_ = auVar90._8_4_;
                  auVar116._12_4_ = auVar90._8_4_;
                  auVar101._4_4_ = -(uint)(auVar102._4_4_ == iVar71);
                  auVar101._12_4_ = -(uint)(auVar102._12_4_ == iVar45);
                  auVar101._0_4_ = auVar101._4_4_;
                  auVar101._8_4_ = auVar101._12_4_;
                  auVar103._4_4_ = auVar90._4_4_;
                  auVar103._0_4_ = auVar90._4_4_;
                  auVar103._8_4_ = auVar90._12_4_;
                  auVar103._12_4_ = auVar90._12_4_;
                  auVar83 = auVar101 & auVar116 | auVar103;
                  auVar102 = packssdw(auVar90,auVar83);
                  auVar16._8_4_ = 0xffffffff;
                  auVar16._0_8_ = 0xffffffffffffffff;
                  auVar16._12_4_ = 0xffffffff;
                  auVar102 = packssdw(auVar102 ^ auVar16,auVar102 ^ auVar16);
                  auVar102 = packsswb(auVar102,auVar102);
                  if ((auVar102 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    puVar54[-0x38] = 0xff;
                  }
                  auVar102 = pshufhw(auVar102,auVar116,0x84);
                  in_XMM2 = pshufhw(auVar83,auVar101,0x84);
                  in_XMM2 = in_XMM2 & auVar102;
                  auVar102 = pshufhw(auVar102,auVar103,0x84);
                  auVar91._8_4_ = 0xffffffff;
                  auVar91._0_8_ = 0xffffffffffffffff;
                  auVar91._12_4_ = 0xffffffff;
                  auVar91 = (auVar102 | in_XMM2) ^ auVar91;
                  auVar102 = packssdw(auVar91,auVar91);
                  in_XMM1 = packsswb(auVar102,auVar102);
                  if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                    puVar54[-0x3c] = 0xff;
                  }
                  uVar63 = uVar63 + 0x10;
                  puVar54 = puVar54 + -0x40;
                } while ((uVar43 + 0x10 & 0x3ffffff0) != uVar63);
              }
              if (0 < (int)local_88dc) {
                uVar79 = (int)s->img_y >> 1;
                if (0 < (int)uVar79) {
                  uVar62 = s->img_x * iVar41;
                  uVar43 = (s->img_y - 1) * uVar62;
                  uVar63 = 0;
                  uVar50 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar70 = 0;
                      do {
                        uVar40 = data_01[uVar70 + uVar63];
                        data_01[uVar70 + uVar63] = data_01[uVar70 + uVar43];
                        data_01[uVar70 + uVar43] = uVar40;
                        uVar70 = uVar70 + 1;
                      } while (uVar62 != uVar70);
                    }
                    uVar50 = uVar50 + 1;
                    uVar43 = uVar43 - uVar62;
                    uVar63 = (ulong)((int)uVar63 + uVar62);
                  } while (uVar50 != uVar79);
                }
              }
              if ((iVar41 == req_comp || req_comp == 0) ||
                 (data_01 = stbi__convert_format(data_01,iVar41,req_comp,s->img_x,s->img_y),
                 data_01 != (uchar *)0x0)) {
                *x = s->img_x;
                *y = s->img_y;
                if (local_8918 == (int *)0x0) {
                  return data_01;
                }
                *local_8918 = s->img_n;
                return data_01;
              }
              goto LAB_001538d5;
            }
          }
        }
      }
      else if (s->read_from_callbacks != 0) {
        psVar65 = s->buffer_start;
        iVar41 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
        if (iVar41 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar65;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar65;
          s->img_buffer_end = psVar65 + iVar41;
        }
        psVar65 = s->img_buffer;
        goto LAB_00154f71;
      }
LAB_001551b2:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar41 = stbi__gif_test(s);
      if (iVar41 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar53 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_8918,0,psVar60);
        if (psVar53 == s) {
          psVar53 = (stbi__context *)0x0;
        }
        if (psVar53 == (stbi__context *)0x0) {
          if (local_88a8.out != (stbi_uc *)0x0) {
            free(local_88a8.out);
          }
          psVar53 = (stbi__context *)0x0;
        }
        else {
          *x = local_88a8.w;
          *y = local_88a8.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar53 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar53,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar47 = (stbi__jpeg *)local_88a8.background;
        goto LAB_00154f33;
      }
      iVar41 = stbi__psd_test(s);
      if (iVar41 != 0) {
        pvVar51 = stbi__psd_load(s,x,y,local_8918,req_comp,ri,bpc);
        return pvVar51;
      }
      iVar41 = stbi__pic_test(s);
      if (iVar41 != 0) {
        pvVar51 = stbi__pic_load(s,x,y,local_8918,req_comp,ri_00);
        return pvVar51;
      }
      iVar41 = stbi__pnm_test(s);
      piVar77 = local_8918;
      if (iVar41 != 0) {
        pvVar51 = stbi__pnm_load(s,x,y,local_8918,req_comp,ri_00);
        return pvVar51;
      }
      iVar41 = stbi__hdr_test(s);
      if (iVar41 != 0) {
        data_02 = stbi__hdr_load(s,x,y,piVar77,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar77;
        }
        psVar60 = stbi__hdr_to_ldr(data_02,*x,*y,req_comp);
        return psVar60;
      }
      iVar41 = stbi__tga_test(s);
      if (iVar41 != 0) {
        pvVar51 = stbi__tga_load(s,x,y,piVar77,req_comp,ri_00);
        return pvVar51;
      }
      pcVar48 = "Image not of any known type, or corrupt";
LAB_001538cc:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar48;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar48 = "Internal error";
        goto LAB_001538cc;
      }
      local_88a8._0_8_ = s;
      iVar41 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      data_00 = (stbi__uint16 *)local_88a8.history;
      uVar7 = local_88a8._0_8_;
      psVar80 = (stbi__uint16 *)0x0;
      if (iVar41 == 0) goto LAB_0015501b;
      iVar41 = 8;
      if (8 < local_88a8.flags) {
        iVar41 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar41;
      local_88a8.history = (stbi_uc *)0x0;
      if ((req_comp == 0) || (iVar41 = *(int *)(local_88a8._0_8_ + 0xc), iVar41 == req_comp)) {
LAB_00154fe8:
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar80 = data_00;
        if (local_8918 != (int *)0x0) {
          *local_8918 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_0015501b:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return psVar80;
      }
      if (local_88a8.flags < 9) {
        data_00 = (stbi__uint16 *)
                  stbi__convert_format
                            ((uchar *)data_00,iVar41,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        data_00 = stbi__convert_format16
                            (data_00,iVar41,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if (data_00 != (stbi__uint16 *)0x0) goto LAB_00154fe8;
    }
LAB_001538d5:
    psVar53 = (stbi__context *)0x0;
  }
  return psVar53;
LAB_00154cc7:
  iVar41 = 0;
LAB_00154ce4:
  if (iVar41 == 0) goto LAB_00154f1d;
  if (psVar47->marker != 0xff) goto LAB_00154cf6;
LAB_00154d00:
  do {
    psVar53 = psVar47->s;
    if ((psVar53->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00154d20:
      if (psVar53->img_buffer_end <= psVar53->img_buffer) goto LAB_00154cf6;
    }
    else {
      iVar41 = (*(psVar53->io).eof)(psVar53->io_user_data);
      if (iVar41 != 0) {
        if (psVar53->read_from_callbacks != 0) goto LAB_00154d20;
        goto LAB_00154cf6;
      }
    }
    psVar53 = psVar47->s;
    psVar60 = psVar53->img_buffer;
    if (psVar53->img_buffer_end <= psVar60) {
      if (psVar53->read_from_callbacks == 0) goto LAB_00154d00;
      psVar60 = psVar53->buffer_start;
      iVar41 = (*(psVar53->io).read)(psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
      if (iVar41 == 0) {
        psVar53->read_from_callbacks = 0;
        psVar53->img_buffer = psVar60;
        psVar53->img_buffer_end = psVar53->buffer_start + 1;
        psVar53->buffer_start[0] = '\0';
      }
      else {
        psVar53->img_buffer = psVar60;
        psVar53->img_buffer_end = psVar60 + iVar41;
      }
      psVar60 = psVar53->img_buffer;
    }
    psVar53->img_buffer = psVar60 + 1;
  } while (*psVar60 != 0xff);
  psVar53 = psVar47->s;
  psVar60 = psVar53->img_buffer;
  if (psVar60 < psVar53->img_buffer_end) {
LAB_00154e2a:
    psVar53->img_buffer = psVar60 + 1;
    sVar38 = *psVar60;
  }
  else {
    if (psVar53->read_from_callbacks != 0) {
      psVar60 = psVar53->buffer_start;
      iVar41 = (*(psVar53->io).read)(psVar53->io_user_data,(char *)psVar60,psVar53->buflen);
      if (iVar41 == 0) {
        psVar53->read_from_callbacks = 0;
        psVar53->img_buffer = psVar60;
        psVar53->img_buffer_end = psVar53->buffer_start + 1;
        psVar53->buffer_start[0] = '\0';
      }
      else {
        psVar53->img_buffer = psVar60;
        psVar53->img_buffer_end = psVar60 + iVar41;
      }
      psVar60 = psVar53->img_buffer;
      goto LAB_00154e2a;
    }
    sVar38 = '\0';
  }
  psVar47->marker = sVar38;
LAB_00154cf6:
  bVar39 = stbi__get_marker(psVar47);
  goto LAB_00153976;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}